

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

ColumnRef __thiscall
clickhouse::ColumnFixedString::Slice(ColumnFixedString *this,size_t begin,size_t len)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  size_t in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  element_type *in_RDI;
  ColumnRef CVar2;
  shared_ptr<clickhouse::ColumnFixedString> result;
  element_type *this_00;
  unsigned_long *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec;
  
  this_00 = in_RDI;
  std::make_shared<clickhouse::ColumnFixedString,unsigned_long_const&>(in_stack_ffffffffffffffb8);
  vec = in_RDX;
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RSI + 2);
  if (in_RDX < pvVar1) {
    SliceVector<std::__cxx11::string>(vec,in_RCX,in_stack_ffffffffffffffd8);
    std::
    __shared_ptr_access<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x235bca);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_RDX,in_RSI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_RDX);
  }
  std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnFixedString,void>
            ((shared_ptr<clickhouse::Column> *)this_00,
             (shared_ptr<clickhouse::ColumnFixedString> *)in_RDI);
  std::shared_ptr<clickhouse::ColumnFixedString>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnFixedString> *)0x235c19);
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (ColumnRef)CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnFixedString::Slice(size_t begin, size_t len) {
    auto result = std::make_shared<ColumnFixedString>(string_size_);

    if (begin < data_.size()) {
        result->data_ = SliceVector(data_, begin, len);
    }

    return result;
}